

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apple_sysf.cpp
# Opt level: O0

void __thiscall apple_sysf_t::_read(apple_sysf_t *this)

{
  uint8_t uVar1;
  int8_t iVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  kstream *pkVar5;
  sysf_store_body_t *this_00;
  pointer p__io;
  unique_ptr<apple_sysf_t::sysf_store_body_t,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
  local_50 [3];
  unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> local_38 [8];
  string local_30;
  apple_sysf_t *local_10;
  apple_sysf_t *this_local;
  
  local_10 = this;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_signature = uVar4;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_unknown = uVar1;
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_unknown1 = uVar4;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_sysf_size = uVar3;
  pkVar5 = (this->super_kstruct).m__io;
  uVar3 = sysf_size(this);
  iVar2 = len_sysf_store_header(this);
  kaitai::kstream::read_bytes_abi_cxx11_
            (&local_30,pkVar5,(long)(int)(((uint)uVar3 - (int)iVar2) + -4));
  std::__cxx11::string::operator=((string *)&this->m__raw_body,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  pkVar5 = (kstream *)operator_new(0x198);
  kaitai::kstream::kstream(pkVar5,&this->m__raw_body);
  std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
  unique_ptr<std::default_delete<kaitai::kstream>,void>(local_38,pkVar5);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
            (&this->m__io__raw_body,
             (unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::~unique_ptr
            ((unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_> *)local_38);
  this_00 = (sysf_store_body_t *)operator_new(0x30);
  p__io = std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::get
                    (&this->m__io__raw_body);
  sysf_store_body_t::sysf_store_body_t(this_00,p__io,this,this->m__root);
  std::
  unique_ptr<apple_sysf_t::sysf_store_body_t,std::default_delete<apple_sysf_t::sysf_store_body_t>>::
  unique_ptr<std::default_delete<apple_sysf_t::sysf_store_body_t>,void>
            ((unique_ptr<apple_sysf_t::sysf_store_body_t,std::default_delete<apple_sysf_t::sysf_store_body_t>>
              *)local_50,this_00);
  std::
  unique_ptr<apple_sysf_t::sysf_store_body_t,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
  ::operator=(&this->m_body,local_50);
  std::
  unique_ptr<apple_sysf_t::sysf_store_body_t,_std::default_delete<apple_sysf_t::sysf_store_body_t>_>
  ::~unique_ptr(local_50);
  uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_crc = uVar4;
  return;
}

Assistant:

void apple_sysf_t::_read() {
    m_signature = m__io->read_u4le();
    m_unknown = m__io->read_u1();
    m_unknown1 = m__io->read_u4le();
    m_sysf_size = m__io->read_u2le();
    m__raw_body = m__io->read_bytes(((sysf_size() - len_sysf_store_header()) - 4));
    m__io__raw_body = std::unique_ptr<kaitai::kstream>(new kaitai::kstream(m__raw_body));
    m_body = std::unique_ptr<sysf_store_body_t>(new sysf_store_body_t(m__io__raw_body.get(), this, m__root));
    m_crc = m__io->read_u4le();
}